

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::PathTypeHandlerBase::SetPrototype
          (PathTypeHandlerBase *this,DynamicObject *instance,RecyclableObject *newPrototype)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  DynamicTypeHandler *typeHandler;
  PathTypeHandlerBase *this_00;
  TypeTransitionMap *oldTypeToPromotedTypeMap_00;
  TypeTransitionMap *local_40;
  TypeTransitionMap *oldTypeToPromotedTypeMap;
  
  if ((((instance->super_RecyclableObject).type.ptr)->flags & TypeFlagMask_EngineExternal) !=
      TypeFlagMask_None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/Type.h"
                                ,0x49,"((this->flags & TypeFlagMask_EngineExternal) == 0)",
                                "Not expected.");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  scriptContext =
       (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  pSVar1 = (((((newPrototype->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_40 = (TypeTransitionMap *)0x0;
  oldTypeToPromotedTypeMap = (TypeTransitionMap *)newPrototype;
  if (scriptContext == pSVar1) {
    iVar4 = (*(newPrototype->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x14])
                      (newPrototype,newPrototype,1,&local_40,0,scriptContext);
    bVar3 = iVar4 != 0;
  }
  else {
    bVar3 = false;
  }
  typeHandler = DynamicObject::GetTypeHandler(instance);
  this_00 = FromTypeHandler(typeHandler);
  oldTypeToPromotedTypeMap_00 = local_40;
  if (!bVar3) {
    oldTypeToPromotedTypeMap_00 = (TypeTransitionMap *)0x0;
  }
  SetPrototypeHelper(this_00,instance,(RecyclableObject *)oldTypeToPromotedTypeMap,
                     oldTypeToPromotedTypeMap_00,scriptContext == pSVar1,scriptContext);
  return;
}

Assistant:

void PathTypeHandlerBase::SetPrototype(DynamicObject* instance, RecyclableObject* newPrototype)
    {
        // No typesharing for ExternalType
        if (instance->GetType()->IsExternal())
        {
#ifdef PROFILE_TYPES
            instance->GetScriptContext()->convertPathToDictionaryProtoCount++;
#endif
            TryConvertToSimpleDictionaryType(instance, GetPathLength())->SetPrototype(instance, newPrototype);
            return;
        }

        ScriptContext* scriptContext = instance->GetScriptContext();
        bool useCache = scriptContext == newPrototype->GetScriptContext();

        TypeTransitionMap * oldTypeToPromotedTypeMap = nullptr;
        bool hasMap = false;
        if (useCache)
        {
            hasMap = newPrototype->GetInternalProperty(newPrototype, Js::InternalPropertyIds::TypeOfPrototypeObjectDictionary, (Js::Var*)&oldTypeToPromotedTypeMap, nullptr, scriptContext);
        }

        PathTypeHandlerBase *_this = PathTypeHandlerBase::FromTypeHandler(instance->GetTypeHandler());
        _this->SetPrototypeHelper(instance, newPrototype, hasMap ? oldTypeToPromotedTypeMap : nullptr, useCache, scriptContext);
    }